

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::GradientCostCase::genOccluderGeometry
          (ObjectData *__return_storage_ptr__,GradientCostCase *this)

{
  GradientCostCase *this_local;
  
  Utils::fastQuadWithGradient(__return_storage_ptr__,0.0,1.0 - this->m_gradientDistance);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccluderGeometry	(void) const { return Utils::fastQuadWithGradient(0.0f, 1.0f - m_gradientDistance); }